

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlParserCtxtPtr
xmlCreatePushParserCtxt(xmlSAXHandlerPtr sax,void *user_data,char *chunk,int size,char *filename)

{
  int iVar1;
  xmlParserInputPtr value;
  xmlParserInputPtr input;
  xmlParserCtxtPtr ctxt;
  char *filename_local;
  int size_local;
  char *chunk_local;
  void *user_data_local;
  xmlSAXHandlerPtr sax_local;
  
  sax_local = (xmlSAXHandlerPtr)xmlNewSAXParserCtxt(sax,user_data);
  if ((xmlParserCtxtPtr)sax_local == (xmlParserCtxtPtr)0x0) {
    sax_local = (xmlSAXHandlerPtr)0x0;
  }
  else {
    ((xmlParserCtxtPtr)sax_local)->options = ((xmlParserCtxtPtr)sax_local)->options & 0xffffefff;
    ((xmlParserCtxtPtr)sax_local)->dictNames = 1;
    value = xmlNewPushInput(filename,chunk,size);
    if (value == (xmlParserInputPtr)0x0) {
      xmlFreeParserCtxt((xmlParserCtxtPtr)sax_local);
      sax_local = (xmlSAXHandlerPtr)0x0;
    }
    else {
      iVar1 = xmlCtxtPushInput((xmlParserCtxtPtr)sax_local,value);
      if (iVar1 < 0) {
        xmlFreeInputStream(value);
        xmlFreeParserCtxt((xmlParserCtxtPtr)sax_local);
        sax_local = (xmlSAXHandlerPtr)0x0;
      }
    }
  }
  return (xmlParserCtxtPtr)sax_local;
}

Assistant:

xmlParserCtxtPtr
xmlCreatePushParserCtxt(xmlSAXHandlerPtr sax, void *user_data,
                        const char *chunk, int size, const char *filename) {
    xmlParserCtxtPtr ctxt;
    xmlParserInputPtr input;

    ctxt = xmlNewSAXParserCtxt(sax, user_data);
    if (ctxt == NULL)
	return(NULL);

    ctxt->options &= ~XML_PARSE_NODICT;
    ctxt->dictNames = 1;

    input = xmlNewPushInput(filename, chunk, size);
    if (input == NULL) {
	xmlFreeParserCtxt(ctxt);
	return(NULL);
    }
    if (xmlCtxtPushInput(ctxt, input) < 0) {
        xmlFreeInputStream(input);
        xmlFreeParserCtxt(ctxt);
        return(NULL);
    }

    return(ctxt);
}